

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

index_pointer __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_into_leaf<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
          (hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer *existing_leaf,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
          *new_leaf,hash_type existing_hash,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  ulong uVar1;
  address a;
  reference pvVar2;
  index_pointer iVar3;
  address b;
  index_pointer iVar4;
  index_pointer iVar5;
  index_pointer local_40;
  index_pointer leaf_ptr;
  index_pointer local_30;
  
  if (shifts < 0x42) {
    iVar4._0_4_ = (uint)hash & 0x3f;
    iVar4.addr_.a_._4_4_ = 0;
    iVar5._0_4_ = (uint)existing_hash & 0x3f;
    iVar5.addr_.a_._4_4_ = 0;
    if (iVar4.internal_ == iVar5.internal_) {
      leaf_ptr = insert_into_leaf<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                           (this,transaction,existing_leaf,new_leaf,existing_hash >> 6,hash >> 6,
                            shifts + 6,parents);
      local_40 = iVar4;
      pvVar2 = chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>::
               emplace_back<pstore::index::details::index_pointer_const&,unsigned_long_const&>
                         (*(chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>
                            **)(this + 8),&leaf_ptr,(unsigned_long *)&local_40);
      uVar1 = (parents.ptr_)->elements_;
      if (0xc < uVar1) {
LAB_0018e987:
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      iVar3.internal_ = (internal_node *)((ulong)pvVar2 | 3);
      (parents.ptr_)->elements_ = uVar1 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)iVar3;
      ((parents.ptr_)->c_)._M_elems[uVar1].position = 0;
    }
    else {
      local_30.addr_ =
           store_leaf_node<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                     (this,transaction,new_leaf,parents);
      local_40 = iVar5;
      leaf_ptr = iVar4;
      pvVar2 = chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>::
               emplace_back<pstore::index::details::index_pointer_const&,pstore::index::details::index_pointer_const&,unsigned_long_const&,unsigned_long_const&>
                         (*(chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>
                            **)(this + 8),existing_leaf,&local_30,(unsigned_long *)&local_40,
                          (unsigned_long *)&leaf_ptr);
      uVar1 = (parents.ptr_)->elements_;
      if (0xc < uVar1) goto LAB_0018e987;
      iVar3.internal_ = (internal_node *)((ulong)pvVar2 | 3);
      (parents.ptr_)->elements_ = uVar1 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)iVar3;
      ((parents.ptr_)->c_)._M_elems[uVar1].position = (ulong)(iVar5._0_4_ <= iVar4._0_4_);
    }
  }
  else {
    a.a_ = (existing_leaf->addr_).a_;
    if ((a.a_ & 2) != 0) {
      __assert_fail("is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
    }
    b = store_leaf_node<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                  (this,transaction,new_leaf,parents);
    details::linear_node::allocate((linear_node *)&local_40.addr_,a,b);
    uVar1 = (parents.ptr_)->elements_;
    if (0xc < uVar1) goto LAB_0018e987;
    iVar3.internal_ = local_40.internal_ | 3;
    (parents.ptr_)->elements_ = uVar1 + 1;
    ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)iVar3;
    ((parents.ptr_)->c_)._M_elems[uVar1].position = 1;
  }
  return (index_pointer)iVar3.internal_;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_leaf (
            transaction_base & transaction, index_pointer const & existing_leaf,
            OtherValueType const & new_leaf, hash_type existing_hash, hash_type hash,
            unsigned shifts, gsl::not_null<parent_stack *> parents) -> index_pointer {

            if (details::depth_is_internal_node (shifts)) {
                auto const new_hash = hash & details::hash_index_mask;
                auto const old_hash = existing_hash & details::hash_index_mask;
                if (new_hash != old_hash) {
                    address const leaf_addr =
                        this->store_leaf_node (transaction, new_leaf, parents);
                    auto const internal_ptr = index_pointer{
                        internal_node::allocate (internals_container_.get (), existing_leaf,
                                                 index_pointer{leaf_addr}, old_hash, new_hash)};
                    parents->push (details::parent_type{
                        internal_ptr, internal_node::get_new_index (new_hash, old_hash)});
                    return internal_ptr;
                }

                // We've found a (partial) hash collision. Replace this leaf node with an internal
                // node. The existing key must be replaced with a sub-hash table and the next 6 bit
                // hash of the existing key computed. If there's still a collision, we repeat the
                // process. The new and existing keys are then inserted in the new sub-hash table.
                // As long as the partial hashes match, we have to create single element internal
                // nodes to represent them. This should happen very rarely with a reasonably good
                // hash function.

                shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
                existing_hash >>= details::hash_index_bits;

                index_pointer const leaf_ptr = this->insert_into_leaf (
                    transaction, existing_leaf, new_leaf, existing_hash, hash, shifts, parents);
                auto const internal_ptr = index_pointer{
                    internal_node::allocate (internals_container_.get (), leaf_ptr, old_hash)};
                parents->push (details::parent_type{internal_ptr, 0U});
                return internal_ptr;
            }

            // We ran out of hash bits: create a new linear node.
            auto const linear_ptr = index_pointer{
                linear_node::allocate (existing_leaf.to_address (),
                                       this->store_leaf_node (transaction, new_leaf, parents))
                    .release ()};
            parents->push (details::parent_type{linear_ptr, 1U});
            return linear_ptr;
        }